

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionEuler::ComputeInertialForce
          (ChBeamSectionEuler *this,ChVector<double> *mFi,ChVector<double> *mTi,
          ChVector<double> *mWvel,ChVector<double> *mWacc,ChVector<double> *mXacc)

{
  ChVectorN<double,_6> Fipp;
  ChVector<double> mT_quadratic;
  ChVector<double> mF_quadratic;
  ChVectorN<double,_6> xpp;
  ChMatrixNM<double,_6,_6> Mi;
  VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> local_278;
  ChVector<double> local_240;
  Matrix<double,_6,_1,_0,_6,_1> local_220;
  double local_1f0;
  double dStack_1e8;
  double local_1e0;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  Matrix<double,_6,_1,_0,_6,_1> local_1b0;
  double local_180 [42];
  
  (*(this->super_ChBeamSection)._vptr_ChBeamSection[0xd])(this,local_180);
  local_220.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (double)mXacc;
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
            (&local_278,&local_1b0,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_278.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_220)
  ;
  local_220.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (double)mWacc;
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
            (&local_278,&local_1b0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_278.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_220)
  ;
  local_278.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_data =
       local_180;
  local_278.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_rows.m_value
       = (long)&local_1b0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_220,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&local_278);
  local_1d0 = 0.0;
  dStack_1c8 = 0.0;
  local_1c0 = 0.0;
  local_1f0 = 0.0;
  dStack_1e8 = 0.0;
  local_1e0 = 0.0;
  (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x10])(this,&local_1d0,&local_1f0,mWvel);
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
            (&local_278,&local_220,0,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (&local_240,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_278,(type *)0x0);
  mFi->m_data[0] = local_240.m_data[0] + local_1d0;
  mFi->m_data[1] = local_240.m_data[1] + dStack_1c8;
  mFi->m_data[2] = local_240.m_data[2] + local_1c0;
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
            (&local_278,&local_220,3,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
            (&local_240,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_278,(type *)0x0);
  mTi->m_data[0] = local_240.m_data[0] + local_1f0;
  mTi->m_data[1] = local_240.m_data[1] + dStack_1e8;
  mTi->m_data[2] = local_240.m_data[2] + local_1e0;
  return;
}

Assistant:

void ChBeamSectionEuler::ComputeInertialForce(
                                    ChVector<>& mFi,          ///< total inertial force returned here
                                    ChVector<>& mTi,          ///< total inertial torque returned here
                                    const ChVector<>& mWvel,  ///< current angular velocity of section, in material frame
                                    const ChVector<>& mWacc,  ///< current angular acceleration of section, in material frame
                                    const ChVector<>& mXacc   ///< current acceleration of section, in material frame (not absolute!)
	) {
		// Default implementation as Fi = [Mi]*{xacc,wacc}+{mF_quadratic,mT_quadratic}
		// but if possible implement it in children classes with ad-hoc faster formulas.
		ChMatrixNM<double, 6, 6> Mi;
		this->ComputeInertiaMatrix(Mi);
		ChVectorN<double, 6> xpp; 
		xpp.segment(0 , 3) = mXacc.eigen();
		xpp.segment(3 , 3) = mWacc.eigen();
		ChVectorN<double, 6> Fipp = Mi * xpp;    // [Mi]*{xacc,wacc}
		ChVector<> mF_quadratic;
		ChVector<> mT_quadratic;
		this->ComputeQuadraticTerms(mF_quadratic, mT_quadratic, mWvel);  // {mF_quadratic,mT_quadratic}
		mFi = ChVector<>(Fipp.segment(0, 3)) + mF_quadratic; 
		mTi = ChVector<>(Fipp.segment(3, 3)) + mT_quadratic;
	}